

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# instance.cpp
# Opt level: O0

void __thiscall Instance::computeLengthConstraint(Instance *this,Train *train)

{
  bool bVar1;
  ast_vector_tpl<z3::expr> *paVar2;
  reference ppEVar3;
  size_type sVar4;
  reference ppEVar5;
  reference pvVar6;
  uint *in_RSI;
  ast_vector_tpl<z3::expr> *in_RDI;
  Edge *edge_1;
  iterator __end2_1;
  iterator __begin2_1;
  vector<Edge_*,_std::allocator<Edge_*>_> *__range2_1;
  expr_vector leftNetwork;
  size_t pathIndex;
  bool inPath;
  Edge *edge;
  iterator __end4;
  iterator __begin4;
  vector<Edge_*,_std::allocator<Edge_*>_> *__range4;
  expr_vector pathVars;
  int length;
  size_t lengthIndex;
  size_t startIndex;
  pathType path;
  iterator __end2;
  iterator __begin2;
  value_type *__range2;
  expr_vector lengthHot;
  size_t time;
  context *in_stack_fffffffffffffe58;
  ast_vector_tpl<z3::expr> *in_stack_fffffffffffffe60;
  Edge *in_stack_fffffffffffffe68;
  ast_vector_tpl<z3::expr> *in_stack_fffffffffffffe70;
  undefined7 in_stack_fffffffffffffe78;
  undefined1 in_stack_fffffffffffffe7f;
  ast_vector_tpl<z3::expr> *in_stack_fffffffffffffe80;
  expr_vector *in_stack_fffffffffffffea8;
  vector<const_Edge_*,_std::allocator<const_Edge_*>_> *in_stack_fffffffffffffeb0;
  __normal_iterator<Edge_**,_std::vector<Edge_*,_std::allocator<Edge_*>_>_> local_120;
  Z3_ast_vector *local_118;
  ast_vector_tpl<z3::expr> *local_c0;
  byte local_b1;
  Edge *local_b0;
  Edge **local_a8;
  __normal_iterator<Edge_**,_std::vector<Edge_*,_std::allocator<Edge_*>_>_> local_a0;
  Z3_ast_vector *local_98;
  uint local_7c;
  ast_vector_tpl<z3::expr> *local_78;
  ast_vector_tpl<z3::expr> *local_70;
  vector<const_Edge_*,_std::allocator<const_Edge_*>_> local_58;
  vector<const_Edge_*,_std::allocator<const_Edge_*>_> *local_40;
  __normal_iterator<std::vector<const_Edge_*,_std::allocator<const_Edge_*>_>_*,_std::vector<std::vector<const_Edge_*,_std::allocator<const_Edge_*>_>,_std::allocator<std::vector<const_Edge_*,_std::allocator<const_Edge_*>_>_>_>_>
  local_38;
  reference local_30;
  ulong local_18;
  uint *local_10;
  
  local_18 = (ulong)in_RSI[4];
  local_10 = in_RSI;
  do {
    if (*(uint *)&in_RDI[0x13].m_vector <= local_18) {
      return;
    }
    z3::ast_vector_tpl<z3::expr>::ast_vector_tpl
              (in_stack_fffffffffffffe60,in_stack_fffffffffffffe58);
    local_30 = std::
               vector<std::vector<std::vector<const_Edge_*,_std::allocator<const_Edge_*>_>,_std::allocator<std::vector<const_Edge_*,_std::allocator<const_Edge_*>_>_>_>,_std::allocator<std::vector<std::vector<const_Edge_*,_std::allocator<const_Edge_*>_>,_std::allocator<std::vector<const_Edge_*,_std::allocator<const_Edge_*>_>_>_>_>_>
               ::operator[]((vector<std::vector<std::vector<const_Edge_*,_std::allocator<const_Edge_*>_>,_std::allocator<std::vector<const_Edge_*,_std::allocator<const_Edge_*>_>_>_>,_std::allocator<std::vector<std::vector<const_Edge_*,_std::allocator<const_Edge_*>_>,_std::allocator<std::vector<const_Edge_*,_std::allocator<const_Edge_*>_>_>_>_>_>
                             *)(in_RDI + 0x18),(ulong)*local_10);
    local_38._M_current =
         (vector<const_Edge_*,_std::allocator<const_Edge_*>_> *)
         std::
         vector<std::vector<const_Edge_*,_std::allocator<const_Edge_*>_>,_std::allocator<std::vector<const_Edge_*,_std::allocator<const_Edge_*>_>_>_>
         ::begin((vector<std::vector<const_Edge_*,_std::allocator<const_Edge_*>_>,_std::allocator<std::vector<const_Edge_*,_std::allocator<const_Edge_*>_>_>_>
                  *)in_stack_fffffffffffffe58);
    local_40 = (vector<const_Edge_*,_std::allocator<const_Edge_*>_> *)
               std::
               vector<std::vector<const_Edge_*,_std::allocator<const_Edge_*>_>,_std::allocator<std::vector<const_Edge_*,_std::allocator<const_Edge_*>_>_>_>
               ::end((vector<std::vector<const_Edge_*,_std::allocator<const_Edge_*>_>,_std::allocator<std::vector<const_Edge_*,_std::allocator<const_Edge_*>_>_>_>
                      *)in_stack_fffffffffffffe58);
    while( true ) {
      bVar1 = __gnu_cxx::operator!=
                        ((__normal_iterator<std::vector<const_Edge_*,_std::allocator<const_Edge_*>_>_*,_std::vector<std::vector<const_Edge_*,_std::allocator<const_Edge_*>_>,_std::allocator<std::vector<const_Edge_*,_std::allocator<const_Edge_*>_>_>_>_>
                          *)in_stack_fffffffffffffe60,
                         (__normal_iterator<std::vector<const_Edge_*,_std::allocator<const_Edge_*>_>_*,_std::vector<std::vector<const_Edge_*,_std::allocator<const_Edge_*>_>,_std::allocator<std::vector<const_Edge_*,_std::allocator<const_Edge_*>_>_>_>_>
                          *)in_stack_fffffffffffffe58);
      if (!bVar1) break;
      __gnu_cxx::
      __normal_iterator<std::vector<const_Edge_*,_std::allocator<const_Edge_*>_>_*,_std::vector<std::vector<const_Edge_*,_std::allocator<const_Edge_*>_>,_std::allocator<std::vector<const_Edge_*,_std::allocator<const_Edge_*>_>_>_>_>
      ::operator*(&local_38);
      std::vector<const_Edge_*,_std::allocator<const_Edge_*>_>::vector
                (in_stack_fffffffffffffeb0,
                 (vector<const_Edge_*,_std::allocator<const_Edge_*>_> *)in_stack_fffffffffffffea8);
      local_70 = (ast_vector_tpl<z3::expr> *)0x0;
      while( true ) {
        in_stack_fffffffffffffe80 = local_70;
        paVar2 = (ast_vector_tpl<z3::expr> *)
                 std::vector<const_Edge_*,_std::allocator<const_Edge_*>_>::size(&local_58);
        if (paVar2 <= in_stack_fffffffffffffe80) break;
        local_78 = local_70;
        local_7c = local_10[2];
        do {
          ppEVar3 = std::vector<const_Edge_*,_std::allocator<const_Edge_*>_>::operator[]
                              (&local_58,(size_type)local_78);
          local_7c = local_7c - (*ppEVar3)->length;
          in_stack_fffffffffffffe7f = false;
          if (0 < (int)local_7c) {
            in_stack_fffffffffffffe70 =
                 (ast_vector_tpl<z3::expr> *)
                 ((long)&(((_Vector_base<const_Edge_*,_std::allocator<const_Edge_*>_> *)
                          &local_78->super_object)->_M_impl).super__Vector_impl_data._M_start + 1);
            local_78 = in_stack_fffffffffffffe70;
            sVar4 = std::vector<const_Edge_*,_std::allocator<const_Edge_*>_>::size(&local_58);
            in_stack_fffffffffffffe7f =
                 in_stack_fffffffffffffe70 < (ast_vector_tpl<z3::expr> *)(sVar4 - 1);
          }
        } while ((bool)in_stack_fffffffffffffe7f != false);
        z3::ast_vector_tpl<z3::expr>::ast_vector_tpl
                  (in_stack_fffffffffffffe60,in_stack_fffffffffffffe58);
        local_98 = &in_RDI[0x10].m_vector;
        local_a0._M_current =
             (Edge **)std::vector<Edge_*,_std::allocator<Edge_*>_>::begin
                                ((vector<Edge_*,_std::allocator<Edge_*>_> *)
                                 in_stack_fffffffffffffe58);
        local_a8 = (Edge **)std::vector<Edge_*,_std::allocator<Edge_*>_>::end
                                      ((vector<Edge_*,_std::allocator<Edge_*>_> *)
                                       in_stack_fffffffffffffe58);
        while( true ) {
          bVar1 = __gnu_cxx::operator!=
                            ((__normal_iterator<Edge_**,_std::vector<Edge_*,_std::allocator<Edge_*>_>_>
                              *)in_stack_fffffffffffffe60,
                             (__normal_iterator<Edge_**,_std::vector<Edge_*,_std::allocator<Edge_*>_>_>
                              *)in_stack_fffffffffffffe58);
          if (!bVar1) break;
          ppEVar5 = __gnu_cxx::
                    __normal_iterator<Edge_**,_std::vector<Edge_*,_std::allocator<Edge_*>_>_>::
                    operator*(&local_a0);
          local_b0 = *ppEVar5;
          local_b1 = 0;
          for (local_c0 = local_70; local_c0 <= local_78;
              local_c0 = (ast_vector_tpl<z3::expr> *)
                         ((long)&(((_Vector_base<const_Edge_*,_std::allocator<const_Edge_*>_> *)
                                  &local_c0->super_object)->_M_impl).super__Vector_impl_data.
                                 _M_start + 1)) {
            in_stack_fffffffffffffe68 = local_b0;
            ppEVar3 = std::vector<const_Edge_*,_std::allocator<const_Edge_*>_>::operator[]
                                (&local_58,(size_type)local_c0);
            if (in_stack_fffffffffffffe68 == *ppEVar3) {
              pvVar6 = std::
                       vector<std::vector<z3::ast_vector_tpl<z3::expr>,_std::allocator<z3::ast_vector_tpl<z3::expr>_>_>,_std::allocator<std::vector<z3::ast_vector_tpl<z3::expr>,_std::allocator<z3::ast_vector_tpl<z3::expr>_>_>_>_>
                       ::operator[]((vector<std::vector<z3::ast_vector_tpl<z3::expr>,_std::allocator<z3::ast_vector_tpl<z3::expr>_>_>,_std::allocator<std::vector<z3::ast_vector_tpl<z3::expr>,_std::allocator<z3::ast_vector_tpl<z3::expr>_>_>_>_>
                                     *)&in_RDI[0x15].m_vector,(ulong)*local_10);
              std::
              vector<z3::ast_vector_tpl<z3::expr>,_std::allocator<z3::ast_vector_tpl<z3::expr>_>_>::
              operator[](pvVar6,local_18);
              z3::ast_vector_tpl<z3::expr>::operator[]
                        (in_RDI,(int)((ulong)in_stack_fffffffffffffe80 >> 0x20));
              z3::ast_vector_tpl<z3::expr>::push_back
                        (in_stack_fffffffffffffe70,(expr *)in_stack_fffffffffffffe68);
              z3::expr::~expr((expr *)0x106b10);
              local_b1 = 1;
              break;
            }
          }
          if ((local_b1 & 1) == 0) {
            pvVar6 = std::
                     vector<std::vector<z3::ast_vector_tpl<z3::expr>,_std::allocator<z3::ast_vector_tpl<z3::expr>_>_>,_std::allocator<std::vector<z3::ast_vector_tpl<z3::expr>,_std::allocator<z3::ast_vector_tpl<z3::expr>_>_>_>_>
                     ::operator[]((vector<std::vector<z3::ast_vector_tpl<z3::expr>,_std::allocator<z3::ast_vector_tpl<z3::expr>_>_>,_std::allocator<std::vector<z3::ast_vector_tpl<z3::expr>,_std::allocator<z3::ast_vector_tpl<z3::expr>_>_>_>_>
                                   *)&in_RDI[0x15].m_vector,(ulong)*local_10);
            std::
            vector<z3::ast_vector_tpl<z3::expr>,_std::allocator<z3::ast_vector_tpl<z3::expr>_>_>::
            operator[](pvVar6,local_18);
            z3::ast_vector_tpl<z3::expr>::operator[]
                      (in_RDI,(int)((ulong)in_stack_fffffffffffffe80 >> 0x20));
            z3::operator!((expr *)CONCAT17(in_stack_fffffffffffffe7f,in_stack_fffffffffffffe78));
            z3::ast_vector_tpl<z3::expr>::push_back
                      (in_stack_fffffffffffffe70,(expr *)in_stack_fffffffffffffe68);
            z3::expr::~expr((expr *)0x106c3b);
            z3::expr::~expr((expr *)0x106c48);
          }
          __gnu_cxx::__normal_iterator<Edge_**,_std::vector<Edge_*,_std::allocator<Edge_*>_>_>::
          operator++(&local_a0);
        }
        z3::mk_and(in_stack_fffffffffffffea8);
        z3::ast_vector_tpl<z3::expr>::push_back
                  (in_stack_fffffffffffffe70,(expr *)in_stack_fffffffffffffe68);
        z3::expr::~expr((expr *)0x106ce2);
        z3::ast_vector_tpl<z3::expr>::~ast_vector_tpl(in_stack_fffffffffffffe60);
        local_70 = (ast_vector_tpl<z3::expr> *)
                   ((long)&(((_Vector_base<const_Edge_*,_std::allocator<const_Edge_*>_> *)
                            &local_70->super_object)->_M_impl).super__Vector_impl_data._M_start + 1)
        ;
      }
      std::vector<const_Edge_*,_std::allocator<const_Edge_*>_>::~vector
                ((vector<const_Edge_*,_std::allocator<const_Edge_*>_> *)in_stack_fffffffffffffe70);
      __gnu_cxx::
      __normal_iterator<std::vector<const_Edge_*,_std::allocator<const_Edge_*>_>_*,_std::vector<std::vector<const_Edge_*,_std::allocator<const_Edge_*>_>,_std::allocator<std::vector<const_Edge_*,_std::allocator<const_Edge_*>_>_>_>_>
      ::operator++(&local_38);
    }
    z3::ast_vector_tpl<z3::expr>::ast_vector_tpl
              (in_stack_fffffffffffffe60,in_stack_fffffffffffffe58);
    local_118 = &in_RDI[0x10].m_vector;
    local_120._M_current =
         (Edge **)std::vector<Edge_*,_std::allocator<Edge_*>_>::begin
                            ((vector<Edge_*,_std::allocator<Edge_*>_> *)in_stack_fffffffffffffe58);
    std::vector<Edge_*,_std::allocator<Edge_*>_>::end
              ((vector<Edge_*,_std::allocator<Edge_*>_> *)in_stack_fffffffffffffe58);
    while( true ) {
      bVar1 = __gnu_cxx::operator!=
                        ((__normal_iterator<Edge_**,_std::vector<Edge_*,_std::allocator<Edge_*>_>_>
                          *)in_stack_fffffffffffffe60,
                         (__normal_iterator<Edge_**,_std::vector<Edge_*,_std::allocator<Edge_*>_>_>
                          *)in_stack_fffffffffffffe58);
      if (!bVar1) break;
      __gnu_cxx::__normal_iterator<Edge_**,_std::vector<Edge_*,_std::allocator<Edge_*>_>_>::
      operator*(&local_120);
      pvVar6 = std::
               vector<std::vector<z3::ast_vector_tpl<z3::expr>,_std::allocator<z3::ast_vector_tpl<z3::expr>_>_>,_std::allocator<std::vector<z3::ast_vector_tpl<z3::expr>,_std::allocator<z3::ast_vector_tpl<z3::expr>_>_>_>_>
               ::operator[]((vector<std::vector<z3::ast_vector_tpl<z3::expr>,_std::allocator<z3::ast_vector_tpl<z3::expr>_>_>,_std::allocator<std::vector<z3::ast_vector_tpl<z3::expr>,_std::allocator<z3::ast_vector_tpl<z3::expr>_>_>_>_>
                             *)&in_RDI[0x15].m_vector,(ulong)*local_10);
      std::vector<z3::ast_vector_tpl<z3::expr>,_std::allocator<z3::ast_vector_tpl<z3::expr>_>_>::
      operator[](pvVar6,local_18);
      z3::ast_vector_tpl<z3::expr>::operator[]
                (in_RDI,(int)((ulong)in_stack_fffffffffffffe80 >> 0x20));
      z3::operator!((expr *)CONCAT17(in_stack_fffffffffffffe7f,in_stack_fffffffffffffe78));
      z3::ast_vector_tpl<z3::expr>::push_back
                (in_stack_fffffffffffffe70,(expr *)in_stack_fffffffffffffe68);
      z3::expr::~expr((expr *)0x106e6a);
      z3::expr::~expr((expr *)0x106e74);
      __gnu_cxx::__normal_iterator<Edge_**,_std::vector<Edge_*,_std::allocator<Edge_*>_>_>::
      operator++(&local_120);
    }
    z3::mk_and(in_stack_fffffffffffffea8);
    z3::ast_vector_tpl<z3::expr>::push_back
              (in_stack_fffffffffffffe70,(expr *)in_stack_fffffffffffffe68);
    z3::expr::~expr((expr *)0x106f14);
    in_stack_fffffffffffffe60 = (ast_vector_tpl<z3::expr> *)&in_RDI[0x19].m_vector;
    z3::mk_or(in_stack_fffffffffffffea8);
    std::vector<z3::expr,_std::allocator<z3::expr>_>::push_back
              ((vector<z3::expr,_std::allocator<z3::expr>_> *)in_stack_fffffffffffffe60,
               (value_type *)in_stack_fffffffffffffe58);
    z3::expr::~expr((expr *)0x106f53);
    z3::ast_vector_tpl<z3::expr>::~ast_vector_tpl(in_stack_fffffffffffffe60);
    z3::ast_vector_tpl<z3::expr>::~ast_vector_tpl(in_stack_fffffffffffffe60);
    local_18 = local_18 + 1;
  } while( true );
}

Assistant:

void Instance::computeLengthConstraint(const Train &train) {
  for (size_t time = train.start.arrivalTime; time < maxTimeSteps; time++) {
    expr_vector lengthHot(*c);
    for (pathType path : trainPaths[train.id]) {
      for (size_t startIndex = 0; startIndex < path.size(); startIndex++) {
        size_t lengthIndex = startIndex;
        int length = train.length;
        do {
          length -= path[lengthIndex]->length;
        } while (length > 0 && ++lengthIndex < path.size() - 1);

        expr_vector pathVars(*c);
        for (const Edge *edge : graph.edges) {
          bool inPath = false;
          for (size_t pathIndex = startIndex; pathIndex <= lengthIndex;
               pathIndex++) {
            if (edge == path[pathIndex]) {
              pathVars.push_back(occupiedVars[train.id][time][edge->id]);
              inPath = true;
              break;
            }
          }
          if (!inPath) {
            pathVars.push_back(!occupiedVars[train.id][time][edge->id]);
          }
        }
        lengthHot.push_back(mk_and(pathVars));
      }
    }
    expr_vector leftNetwork(*c);
    for (const Edge *edge : graph.edges)
      leftNetwork.push_back(!occupiedVars[train.id][time][edge->id]);

    lengthHot.push_back(mk_and(leftNetwork));
    constraints.push_back(mk_or(lengthHot));
  }
}